

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptArray::IsMissingHeadSegmentItemImpl<void*>(JavascriptArray *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegmentBase *pSVar4;
  
  pSVar4 = (this->head).ptr;
  if (pSVar4->length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x32a,"(index < head->length)","index < head->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pSVar4 = (this->head).ptr;
  }
  return *(undefined1 **)(&pSVar4[1].left + (ulong)index * 2) == &DAT_40002fff80002;
}

Assistant:

bool JavascriptArray::IsMissingHeadSegmentItemImpl(const uint32 index) const
    {
        Assert(index < head->length);

        return SparseArraySegment<T>::IsMissingItem(&SparseArraySegment<T>::From(head)->elements[index]);
    }